

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::InodeFileConfig::Serialize(InodeFileConfig *this,Message *msg)

{
  pointer pbVar1;
  pointer pIVar2;
  uint8_t *src_begin;
  ulong uVar3;
  Message *msg_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  pointer pbVar4;
  pointer this_00;
  
  uVar3 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  if ((uVar3 & 2) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,1,this->scan_interval_ms_);
    uVar3 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar3 & 4) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,2,this->scan_delay_ms_);
    uVar3 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar3 & 8) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,3,this->scan_batch_size_);
    uVar3 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar3 & 0x10) != 0) {
    protozero::Message::AppendTinyVarInt(msg,4,(uint)this->do_not_scan_);
  }
  pbVar1 = (this->scan_mount_points_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (this->scan_mount_points_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    protozero::Message::AppendBytes(msg,5,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
  }
  pIVar2 = (this->mount_point_mapping_).
           super__Vector_base<perfetto::protos::gen::InodeFileConfig_MountPointMappingEntry,_std::allocator<perfetto::protos::gen::InodeFileConfig_MountPointMappingEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->mount_point_mapping_).
                 super__Vector_base<perfetto::protos::gen::InodeFileConfig_MountPointMappingEntry,_std::allocator<perfetto::protos::gen::InodeFileConfig_MountPointMappingEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pIVar2; this_00 = this_00 + 1
      ) {
    msg_00 = protozero::Message::BeginNestedMessageInternal(msg,6);
    InodeFileConfig_MountPointMappingEntry::Serialize(this_00,msg_00);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void InodeFileConfig::Serialize(::protozero::Message* msg) const {
  // Field 1: scan_interval_ms
  if (_has_field_[1]) {
    msg->AppendVarInt(1, scan_interval_ms_);
  }

  // Field 2: scan_delay_ms
  if (_has_field_[2]) {
    msg->AppendVarInt(2, scan_delay_ms_);
  }

  // Field 3: scan_batch_size
  if (_has_field_[3]) {
    msg->AppendVarInt(3, scan_batch_size_);
  }

  // Field 4: do_not_scan
  if (_has_field_[4]) {
    msg->AppendTinyVarInt(4, do_not_scan_);
  }

  // Field 5: scan_mount_points
  for (auto& it : scan_mount_points_) {
    msg->AppendString(5, it);
  }

  // Field 6: mount_point_mapping
  for (auto& it : mount_point_mapping_) {
    it.Serialize(msg->BeginNestedMessage<::protozero::Message>(6));
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}